

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::PrintInitExpr(BinaryReaderObjdump *this,InitExpr *expr)

{
  uint uVar1;
  ObjdumpState *pOVar2;
  ulong uVar3;
  pointer pbVar4;
  size_type sVar5;
  char *pcVar6;
  pointer pbVar7;
  _Alloc_hider _Var8;
  char buffer [40];
  char acStack_48 [48];
  
  switch(expr->type) {
  case I32:
    PrintDetails(this," - init i32=%d\n",(ulong)(expr->value).index);
    return;
  case F32:
    WriteFloatHex(acStack_48,0x14,(expr->value).i32);
    pcVar6 = " - init f32=%s\n";
    break;
  case I64:
    PrintDetails(this," - init i64=%ld\n",(expr->value).i64);
    return;
  case F64:
    WriteDoubleHex(acStack_48,0x28,(expr->value).i64);
    pcVar6 = " - init f64=%s\n";
    break;
  case V128:
    PrintDetails(this," - init v128=0x%08x 0x%08x 0x%08x 0x%08x \n",(ulong)(expr->value).index,
                 (ulong)*(uint *)((long)&expr->value + 4),(ulong)*(uint *)((long)&expr->value + 8),
                 (ulong)*(uint *)((long)&expr->value + 0xc));
    return;
  case Global:
    PrintDetails(this," - init global=%u",(ulong)(expr->value).index);
    uVar1 = (expr->value).index;
    pOVar2 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
    pbVar4 = (pOVar2->global_names).names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar7 = (pOVar2->global_names).names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    goto LAB_0012971a;
  case FuncRef:
    PrintDetails(this," - init ref.func:%u",(ulong)(expr->value).index);
    uVar1 = (expr->value).index;
    pOVar2 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
    pbVar4 = (pOVar2->function_names).names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar7 = (pOVar2->function_names).names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
LAB_0012971a:
    _Var8._M_p = (pointer)0x0;
    uVar3 = (ulong)uVar1;
    sVar5 = 0;
    if (uVar3 < (ulong)((long)pbVar7 - (long)pbVar4 >> 5)) {
      _Var8._M_p = pbVar4[uVar3]._M_dataplus._M_p;
      sVar5 = pbVar4[uVar3]._M_string_length;
    }
    if (sVar5 != 0) {
      PrintDetails(this," <%.*s>",sVar5,_Var8._M_p);
    }
    pcVar6 = "\n";
LAB_00129758:
    PrintDetails(this,pcVar6);
    return;
  case NullRef:
    pcVar6 = " - init nullref\n";
    goto LAB_00129758;
  default:
    goto switchD_00129605_default;
  }
  PrintDetails(this,pcVar6,acStack_48);
switchD_00129605_default:
  return;
}

Assistant:

void BinaryReaderObjdump::PrintInitExpr(const InitExpr& expr) {
  switch (expr.type) {
    case InitExprType::I32:
      PrintDetails(" - init i32=%d\n", expr.value.i32);
      break;
    case InitExprType::I64:
      PrintDetails(" - init i64=%" PRId64 "\n", expr.value.i64);
      break;
    case InitExprType::F64: {
      char buffer[WABT_MAX_DOUBLE_HEX];
      WriteDoubleHex(buffer, sizeof(buffer), expr.value.f64);
      PrintDetails(" - init f64=%s\n", buffer);
      break;
    }
    case InitExprType::F32: {
      char buffer[WABT_MAX_FLOAT_HEX];
      WriteFloatHex(buffer, sizeof(buffer), expr.value.f32);
      PrintDetails(" - init f32=%s\n", buffer);
      break;
    }
    case InitExprType::V128: {
      PrintDetails(" - init v128=0x%08x 0x%08x 0x%08x 0x%08x \n",
                   expr.value.v128_v.u32(0), expr.value.v128_v.u32(1),
                   expr.value.v128_v.u32(2), expr.value.v128_v.u32(3));
      break;
    }
    case InitExprType::Global: {
      PrintDetails(" - init global=%" PRIindex, expr.value.index);
      string_view name = GetGlobalName(expr.value.index);
      if (!name.empty()) {
        PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
      }
      PrintDetails("\n");
      break;
    }
    case InitExprType::FuncRef: {
      PrintDetails(" - init ref.func:%" PRIindex, expr.value.index);
      string_view name = GetFunctionName(expr.value.index);
      if (!name.empty()) {
        PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
      }
      PrintDetails("\n");
      break;
    }
    case InitExprType::NullRef: {
      PrintDetails(" - init nullref\n");
      break;
    }
  }
}